

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Message *msg;
  int i;
  uint uVar2;
  char message [10];
  
  iVar1 = open("shared.dat",0x242,0x1b6);
  if (iVar1 == -1) {
    puts("open returned (-1)");
    iVar1 = -1;
  }
  else {
    msg = Message::CopyToMemoryMappedFile(iVar1);
    for (uVar2 = 0; uVar2 != 100; uVar2 = uVar2 + 1) {
      sprintf(message,"%d\n",(ulong)uVar2);
      Message::EnqueueMessage(msg,message);
      printf("enqueued %d\n",(ulong)uVar2);
    }
    puts("message queue written");
    getchar();
    Message::ReleaseFile(msg,iVar1);
    close(iVar1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{

    const char *sharedFileName = "shared.dat";
    const mode_t mode = 0666;
    const int openFlags = (O_CREAT | O_TRUNC | O_RDWR);
    int fd = open(sharedFileName, openFlags, mode);

    if(fd == (-1))
    {
        printf("open returned (-1)\n");
        return (-1);
    }

    Message* msg = Message::CopyToMemoryMappedFile(fd);

    for(int i = 0; i < 100; i++)
    {
        char message[10];
        sprintf(message, "%d\n", i);
        msg->EnqueueMessage(&message[0]);
        printf("enqueued %d\n", i);
    }

    printf("message queue written\n");
    getchar();

    Message::ReleaseFile(msg, fd);

    close(fd);
}